

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmultiphysicselement.cpp
# Opt level: O2

void __thiscall
TPZMultiphysicsElement::ComputeRequiredDataT<double>
          (TPZMultiphysicsElement *this,TPZVec<double> *intpointtemp,
          TPZVec<TPZTransform<double>_> *trvec,TPZVec<TPZMaterialDataT<double>_> *datavec)

{
  int iVar1;
  long lVar2;
  long lVar3;
  TPZCompEl *this_00;
  TPZGeoEl *pTVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  TPZManVector<double,_3> intpoint;
  double local_70;
  TPZManVector<double,_3> local_68;
  
  lVar2 = (**(code **)(*(long *)&this->super_TPZCompEl + 0x270))();
  lVar6 = 0;
  if (lVar2 < 1) {
    lVar2 = lVar6;
  }
  lVar7 = 0;
  for (lVar5 = 0; lVar2 != lVar5; lVar5 = lVar5 + 1) {
    lVar3 = (**(code **)(*(long *)&this->super_TPZCompEl + 600))(this,lVar5);
    if (lVar3 != 0) {
      this_00 = (TPZCompEl *)
                __dynamic_cast(lVar3,&TPZCompEl::typeinfo,&TPZInterpolationSpace::typeinfo,0);
      if (this_00 != (TPZCompEl *)0x0) {
        pTVar4 = TPZCompEl::Reference(this_00);
        iVar1 = (**(code **)(*(long *)pTVar4 + 0x210))(pTVar4);
        local_70 = 0.0;
        TPZManVector<double,_3>::TPZManVector(&local_68,(long)iVar1,&local_70);
        TPZTransform<double>::Apply
                  ((TPZTransform<double> *)
                   ((long)(trvec->fStore->fMult).super_TPZFMatrix<double>.fPivot.fExtAlloc +
                   lVar6 + -0x68),intpointtemp,&local_68.super_TPZVec<double>);
        (**(code **)(*(long *)this_00 + 0x2a8))
                  (this_00,(long)(datavec->fStore->super_TPZMaterialData).super_TPZShapeData.
                                 fCornerNodeIds.fExtAlloc + lVar7 + -0x30,&local_68);
        TPZManVector<double,_3>::~TPZManVector(&local_68);
      }
    }
    lVar7 = lVar7 + 0x8230;
    lVar6 = lVar6 + 0x1a0;
  }
  return;
}

Assistant:

void TPZMultiphysicsElement::ComputeRequiredDataT(TPZVec<REAL> &intpointtemp, TPZVec<TPZTransform<> > &trvec, TPZVec<TPZMaterialDataT<TVar>> &datavec)
{
    int64_t ElemVecSize = NMeshes();
    for (int64_t iref = 0; iref < ElemVecSize; iref++)
    {
        TPZInterpolationSpace *msp  = dynamic_cast <TPZInterpolationSpace *>(Element(iref));
        if (!msp) {
            continue;
        }
        
        TPZManVector<REAL,3> intpoint(msp->Reference()->Dimension(),0.);
        
        trvec[iref].Apply(intpointtemp, intpoint);
        
        msp->ComputeRequiredData(datavec[iref], intpoint);
    }
}